

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::unsimplify(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *x,
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *r,VarStatus *rows,VarStatus *cols,bool isOptimal)

{
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *this_00;
  uint *puVar1;
  undefined1 (*pauVar2) [16];
  byte *pbVar3;
  char cVar4;
  SPxOut *pSVar5;
  long lVar6;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar7;
  undefined8 uVar8;
  long *plVar9;
  pointer pnVar10;
  pointer pnVar11;
  bool bVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  int iVar15;
  pointer pnVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  Verbosity old_verbosity;
  uint uStack_264;
  uint auStack_260 [5];
  undefined3 uStack_24b;
  uint local_248 [3];
  bool local_23c;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_238;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_228;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_220;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_218;
  undefined8 uStack_210;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_208;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_200;
  undefined4 local_1f4;
  VarStatus *local_1f0;
  uint local_1c8 [2];
  uint auStack_1c0 [2];
  uint local_1b8 [2];
  undefined8 uStack_1b0;
  uint local_1a8 [4];
  uint local_198 [2];
  uint auStack_190 [2];
  uint local_188 [2];
  undefined8 uStack_180;
  uint local_178 [4];
  uint local_168 [2];
  uint auStack_160 [2];
  uint local_158 [2];
  undefined8 uStack_150;
  uint local_148 [4];
  uint local_138 [2];
  uint auStack_130 [2];
  uint local_128 [2];
  undefined8 uStack_120;
  uint local_118 [2];
  cpp_dec_float<50U,_int,_void> local_110;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  pSVar5 = (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).spxout;
  local_228 = x;
  local_220 = y;
  local_208 = (DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               *)r;
  local_200 = s;
  local_1f0 = rows;
  if ((pSVar5 != (SPxOut *)0x0) && (2 < (int)pSVar5->m_verbosity)) {
    old_verbosity = pSVar5->m_verbosity;
    local_1f4 = 3;
    (*pSVar5->_vptr_SPxOut[2])();
    pSVar5 = (this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar5->m_streams[pSVar5->m_verbosity]," --- unsimplifying solution and basis",0x25);
    cVar4 = (char)pSVar5->m_streams[pSVar5->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar5->m_streams[pSVar5->m_verbosity] + -0x18) +
                    cVar4);
    std::ostream::put(cVar4);
    std::ostream::flush();
    pSVar5 = (this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    (*pSVar5->_vptr_SPxOut[2])(pSVar5,&old_verbosity);
  }
  pnVar16 = (local_228->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(local_228->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar16) >> 3) *
          -0x49249249) {
    lVar18 = 0xc;
    lVar20 = 0;
    do {
      puVar1 = (pnVar16->m_backend).data._M_elems + lVar18 + -0xc;
      local_138 = *(uint (*) [2])puVar1;
      auStack_130 = *(uint (*) [2])(puVar1 + 2);
      puVar1 = (pnVar16->m_backend).data._M_elems + lVar18 + -8;
      local_128 = *(uint (*) [2])puVar1;
      uStack_120 = *(undefined8 *)(puVar1 + 2);
      local_118 = *(uint (*) [2])((pnVar16->m_backend).data._M_elems + lVar18 + -4);
      uVar19 = (pnVar16->m_backend).data._M_elems[lVar18 + -2];
      cVar4 = (char)(pnVar16->m_backend).data._M_elems[lVar18 + -1];
      puVar1 = (pnVar16->m_backend).data._M_elems + lVar18;
      uVar13._0_4_ = puVar1[0];
      uVar13._4_4_ = puVar1[1];
      uStack_210 = 0;
      local_218 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)uVar13;
      epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_68,this);
      local_248[0] = local_118[0];
      local_248[1] = local_118[1];
      auStack_260[2] = local_128[0];
      auStack_260[3] = local_128[1];
      stack0xfffffffffffffdb0 = (undefined5)uStack_120;
      uStack_24b = (undefined3)((ulong)uStack_120 >> 0x28);
      old_verbosity = local_138[0];
      uStack_264 = local_138[1];
      uVar8 = _old_verbosity;
      auStack_260[0] = auStack_130[0];
      auStack_260[1] = auStack_130[1];
      local_23c = (bool)cVar4;
      if ((cVar4 == '\x01') &&
         (old_verbosity = local_138[0],
         old_verbosity != ERROR || (fpclass_type)local_218 != cpp_dec_float_finite)) {
        local_23c = false;
      }
      if ((((fpclass_type)local_218 == cpp_dec_float_NaN) || (local_68.fpclass == cpp_dec_float_NaN)
          ) || (local_248[2] = uVar19,
               local_238 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)uVar13, _old_verbosity = uVar8,
               iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,&local_68),
               0 < iVar15)) {
        pnVar16 = (local_228->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_248._0_8_ = *(undefined8 *)((pnVar16->m_backend).data._M_elems + lVar18 + -4);
        puVar1 = (pnVar16->m_backend).data._M_elems + lVar18 + -0xc;
        _old_verbosity = *(undefined8 *)puVar1;
        auStack_260._0_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (pnVar16->m_backend).data._M_elems + lVar18 + -8;
        auStack_260._8_8_ = *(undefined8 *)puVar1;
        uVar13 = *(undefined8 *)(puVar1 + 2);
        stack0xfffffffffffffdb0 = (undefined5)uVar13;
        uStack_24b = (undefined3)((ulong)uVar13 >> 0x28);
        local_248[2] = (pnVar16->m_backend).data._M_elems[lVar18 + -2];
        local_23c = SUB41((pnVar16->m_backend).data._M_elems[lVar18 + -1],0);
        puVar1 = (pnVar16->m_backend).data._M_elems + lVar18;
        local_238._0_4_ = puVar1[0];
        local_238._4_4_ = puVar1[1];
      }
      else {
        local_238 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0xa00000000;
        old_verbosity = 0;
        uStack_264 = 0;
        auStack_260[0] = 0;
        auStack_260[1] = 0;
        auStack_260[2] = 0;
        auStack_260[3] = 0;
        stack0xfffffffffffffdb0 = 0;
        uStack_24b = 0;
        local_248[0] = 0;
        local_248[1] = 0;
        local_248[2] = 0;
        local_23c = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&old_verbosity,0.0);
      }
      pnVar16 = (this->m_prim).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((pnVar16->m_backend).data._M_elems + lVar18 + -4) = local_248._0_8_;
      puVar1 = (pnVar16->m_backend).data._M_elems + lVar18 + -8;
      *(undefined8 *)puVar1 = auStack_260._8_8_;
      *(ulong *)(puVar1 + 2) = CONCAT35(uStack_24b,stack0xfffffffffffffdb0);
      puVar1 = (pnVar16->m_backend).data._M_elems + lVar18 + -0xc;
      *(undefined8 *)puVar1 = _old_verbosity;
      *(undefined8 *)(puVar1 + 2) = auStack_260._0_8_;
      (pnVar16->m_backend).data._M_elems[lVar18 + -2] = local_248[2];
      *(bool *)((pnVar16->m_backend).data._M_elems + lVar18 + -1) = local_23c;
      *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        **)((pnVar16->m_backend).data._M_elems + lVar18) = local_238;
      lVar6 = *(long *)local_208;
      local_148._0_8_ = *(undefined8 *)(lVar6 + -0x10 + lVar18 * 4);
      puVar1 = (uint *)(lVar6 + -0x30 + lVar18 * 4);
      local_168 = *(uint (*) [2])puVar1;
      auStack_160 = *(uint (*) [2])(puVar1 + 2);
      puVar1 = (uint *)(lVar6 + -0x20 + lVar18 * 4);
      local_158 = *(uint (*) [2])puVar1;
      uStack_150 = *(undefined8 *)(puVar1 + 2);
      iVar15 = *(int *)(lVar6 + -8 + lVar18 * 4);
      cVar4 = *(char *)(lVar6 + -4 + lVar18 * 4);
      pVVar7 = *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 **)(lVar6 + lVar18 * 4);
      uStack_210 = 0;
      local_218 = pVVar7;
      epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_a0,this);
      local_248[0] = local_148[0];
      local_248[1] = local_148[1];
      auStack_260[2] = local_158[0];
      auStack_260[3] = local_158[1];
      stack0xfffffffffffffdb0 = (undefined5)uStack_150;
      uStack_24b = (undefined3)((ulong)uStack_150 >> 0x28);
      old_verbosity = local_168[0];
      uStack_264 = local_168[1];
      uVar13 = _old_verbosity;
      auStack_260[0] = auStack_160[0];
      auStack_260[1] = auStack_160[1];
      local_23c = (bool)cVar4;
      if ((cVar4 == '\x01') &&
         (old_verbosity = local_168[0], old_verbosity != ERROR || (fpclass_type)local_218 != 0)) {
        local_23c = false;
      }
      if ((((fpclass_type)local_218 == 2) || (local_a0.fpclass == cpp_dec_float_NaN)) ||
         (local_248[2] = iVar15, local_238 = pVVar7, _old_verbosity = uVar13,
         iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,&local_a0), 0 < iVar15)
         ) {
        lVar6 = *(long *)local_208;
        local_248._0_8_ = *(undefined8 *)(lVar6 + -0x10 + lVar18 * 4);
        pauVar2 = (undefined1 (*) [16])(lVar6 + -0x30 + lVar18 * 4);
        auVar14 = *pauVar2;
        puVar1 = (uint *)(lVar6 + -0x20 + lVar18 * 4);
        auStack_260._8_8_ = *(undefined8 *)puVar1;
        uVar13 = *(undefined8 *)(puVar1 + 2);
        stack0xfffffffffffffdb0 = (undefined5)uVar13;
        uStack_24b = (undefined3)((ulong)uVar13 >> 0x28);
        local_248[2] = *(uint *)(lVar6 + -8 + lVar18 * 4);
        local_23c = *(bool *)(lVar6 + -4 + lVar18 * 4);
        local_238 = *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      **)(lVar6 + lVar18 * 4);
        _old_verbosity = auVar14;
        if ((this->m_thesense == MAXIMIZE) &&
           (old_verbosity = (Verbosity)*(undefined8 *)*pauVar2, bVar12 = old_verbosity != ERROR,
           (fpclass_type)local_238 != cpp_dec_float_finite || bVar12)) {
          local_23c = (bool)(local_23c ^ 1);
        }
      }
      else {
        local_238 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0xa00000000;
        _old_verbosity = (undefined1  [16])0x0;
        auStack_260[2] = 0;
        auStack_260[3] = 0;
        stack0xfffffffffffffdb0 = 0;
        uStack_24b = 0;
        local_248[0] = 0;
        local_248[1] = 0;
        local_248[2] = 0;
        local_23c = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&old_verbosity,0.0);
      }
      pnVar16 = (this->m_redCost).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((pnVar16->m_backend).data._M_elems + lVar18 + -4) = local_248._0_8_;
      puVar1 = (pnVar16->m_backend).data._M_elems + lVar18 + -8;
      *(undefined8 *)puVar1 = auStack_260._8_8_;
      *(ulong *)(puVar1 + 2) = CONCAT35(uStack_24b,stack0xfffffffffffffdb0);
      puVar1 = (pnVar16->m_backend).data._M_elems + lVar18 + -0xc;
      *(undefined8 *)puVar1 = _old_verbosity;
      *(undefined8 *)(puVar1 + 2) = auStack_260._0_8_;
      (pnVar16->m_backend).data._M_elems[lVar18 + -2] = local_248[2];
      *(bool *)((pnVar16->m_backend).data._M_elems + lVar18 + -1) = local_23c;
      *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        **)((pnVar16->m_backend).data._M_elems + lVar18) = local_238;
      (this->m_cBasisStat).data[lVar20] = cols[lVar20];
      lVar20 = lVar20 + 1;
      pnVar16 = (local_228->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar18 = lVar18 + 0xe;
    } while (lVar20 < (int)((ulong)((long)(local_228->val).
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar16
                                   ) >> 3) * -0x49249249);
  }
  pnVar16 = (local_220->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(local_220->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar16) >> 3) *
          -0x49249249) {
    lVar18 = 0xc;
    lVar20 = 0;
    do {
      puVar1 = (pnVar16->m_backend).data._M_elems + lVar18 + -0xc;
      local_198 = *(uint (*) [2])puVar1;
      auStack_190 = *(uint (*) [2])(puVar1 + 2);
      puVar1 = (pnVar16->m_backend).data._M_elems + lVar18 + -8;
      local_188 = *(uint (*) [2])puVar1;
      uStack_180 = *(undefined8 *)(puVar1 + 2);
      local_178._0_8_ = *(undefined8 *)((pnVar16->m_backend).data._M_elems + lVar18 + -4);
      uVar19 = (pnVar16->m_backend).data._M_elems[lVar18 + -2];
      cVar4 = (char)(pnVar16->m_backend).data._M_elems[lVar18 + -1];
      puVar1 = (pnVar16->m_backend).data._M_elems + lVar18;
      uVar8._0_4_ = puVar1[0];
      uVar8._4_4_ = puVar1[1];
      uStack_210 = 0;
      local_218 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)uVar8;
      epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_d8,this);
      local_248[0] = local_178[0];
      local_248[1] = local_178[1];
      auStack_260[2] = local_188[0];
      auStack_260[3] = local_188[1];
      stack0xfffffffffffffdb0 = (undefined5)uStack_180;
      uStack_24b = (undefined3)((ulong)uStack_180 >> 0x28);
      old_verbosity = local_198[0];
      uStack_264 = local_198[1];
      uVar13 = _old_verbosity;
      auStack_260[0] = auStack_190[0];
      auStack_260[1] = auStack_190[1];
      local_23c = (bool)cVar4;
      if ((cVar4 == '\x01') &&
         (old_verbosity = local_198[0],
         old_verbosity != ERROR || (fpclass_type)local_218 != cpp_dec_float_finite)) {
        local_23c = false;
      }
      if ((((fpclass_type)local_218 == cpp_dec_float_NaN) || (local_d8.fpclass == cpp_dec_float_NaN)
          ) || (local_248[2] = uVar19,
               local_238 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)uVar8, _old_verbosity = uVar13,
               iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,&local_d8),
               0 < iVar15)) {
        pnVar16 = (local_220->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_248._0_8_ = *(undefined8 *)((pnVar16->m_backend).data._M_elems + lVar18 + -4);
        puVar1 = (pnVar16->m_backend).data._M_elems + lVar18 + -0xc;
        _old_verbosity = *(undefined8 *)puVar1;
        auStack_260._0_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (pnVar16->m_backend).data._M_elems + lVar18 + -8;
        auStack_260._8_8_ = *(undefined8 *)puVar1;
        uVar13 = *(undefined8 *)(puVar1 + 2);
        stack0xfffffffffffffdb0 = (undefined5)uVar13;
        uStack_24b = (undefined3)((ulong)uVar13 >> 0x28);
        local_248[2] = (pnVar16->m_backend).data._M_elems[lVar18 + -2];
        local_23c = SUB41((pnVar16->m_backend).data._M_elems[lVar18 + -1],0);
        puVar1 = (pnVar16->m_backend).data._M_elems + lVar18;
        local_238._0_4_ = puVar1[0];
        local_238._4_4_ = puVar1[1];
        if ((this->m_thesense == MAXIMIZE) &&
           ((fpclass_type)local_238 != cpp_dec_float_finite || old_verbosity != ERROR)) {
          local_23c = (bool)(local_23c ^ 1);
        }
      }
      else {
        local_238 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0xa00000000;
        old_verbosity = 0;
        uStack_264 = 0;
        auStack_260[0] = 0;
        auStack_260[1] = 0;
        auStack_260[2] = 0;
        auStack_260[3] = 0;
        stack0xfffffffffffffdb0 = 0;
        uStack_24b = 0;
        local_248[0] = 0;
        local_248[1] = 0;
        local_248[2] = 0;
        local_23c = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&old_verbosity,0.0);
      }
      pnVar16 = (this->m_dual).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((pnVar16->m_backend).data._M_elems + lVar18 + -4) = local_248._0_8_;
      puVar1 = (pnVar16->m_backend).data._M_elems + lVar18 + -8;
      *(undefined8 *)puVar1 = auStack_260._8_8_;
      *(ulong *)(puVar1 + 2) = CONCAT35(uStack_24b,stack0xfffffffffffffdb0);
      puVar1 = (pnVar16->m_backend).data._M_elems + lVar18 + -0xc;
      *(undefined8 *)puVar1 = _old_verbosity;
      *(undefined8 *)(puVar1 + 2) = auStack_260._0_8_;
      (pnVar16->m_backend).data._M_elems[lVar18 + -2] = local_248[2];
      *(bool *)((pnVar16->m_backend).data._M_elems + lVar18 + -1) = local_23c;
      *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        **)((pnVar16->m_backend).data._M_elems + lVar18) = local_238;
      pnVar16 = (local_200->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_1a8._0_8_ = *(undefined8 *)((pnVar16->m_backend).data._M_elems + lVar18 + -4);
      puVar1 = (pnVar16->m_backend).data._M_elems + lVar18 + -0xc;
      local_1c8 = *(uint (*) [2])puVar1;
      auStack_1c0 = *(uint (*) [2])(puVar1 + 2);
      puVar1 = (pnVar16->m_backend).data._M_elems + lVar18 + -8;
      local_1b8 = *(uint (*) [2])puVar1;
      uStack_1b0 = *(undefined8 *)(puVar1 + 2);
      uVar19 = (pnVar16->m_backend).data._M_elems[lVar18 + -2];
      cVar4 = (char)(pnVar16->m_backend).data._M_elems[lVar18 + -1];
      pVVar7 = *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 **)((pnVar16->m_backend).data._M_elems + lVar18);
      uStack_210 = 0;
      local_218 = pVVar7;
      epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_110,this);
      local_248[0] = local_1a8[0];
      local_248[1] = local_1a8[1];
      auStack_260[2] = local_1b8[0];
      auStack_260[3] = local_1b8[1];
      stack0xfffffffffffffdb0 = (undefined5)uStack_1b0;
      uStack_24b = (undefined3)((ulong)uStack_1b0 >> 0x28);
      old_verbosity = local_1c8[0];
      uStack_264 = local_1c8[1];
      uVar13 = _old_verbosity;
      auStack_260[0] = auStack_1c0[0];
      auStack_260[1] = auStack_1c0[1];
      local_23c = (bool)cVar4;
      if ((cVar4 == '\x01') &&
         (old_verbosity = local_1c8[0], old_verbosity != ERROR || (fpclass_type)local_218 != 0)) {
        local_23c = false;
      }
      if ((((fpclass_type)local_218 == 2) || (local_110.fpclass == cpp_dec_float_NaN)) ||
         (local_248[2] = uVar19, local_238 = pVVar7, _old_verbosity = uVar13,
         iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,&local_110), 0 < iVar15
         )) {
        pnVar16 = (local_200->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_248._0_8_ = *(undefined8 *)((pnVar16->m_backend).data._M_elems + lVar18 + -4);
        _old_verbosity = *(undefined1 (*) [16])((pnVar16->m_backend).data._M_elems + lVar18 + -0xc);
        puVar1 = (pnVar16->m_backend).data._M_elems + lVar18 + -8;
        auStack_260._8_8_ = *(undefined8 *)puVar1;
        uVar13 = *(undefined8 *)(puVar1 + 2);
        stack0xfffffffffffffdb0 = (undefined5)uVar13;
        uStack_24b = (undefined3)((ulong)uVar13 >> 0x28);
        local_248[2] = (pnVar16->m_backend).data._M_elems[lVar18 + -2];
        local_23c = SUB41((pnVar16->m_backend).data._M_elems[lVar18 + -1],0);
        puVar1 = (pnVar16->m_backend).data._M_elems + lVar18;
        local_238._0_4_ = puVar1[0];
        local_238._4_4_ = puVar1[1];
      }
      else {
        local_238 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0xa00000000;
        _old_verbosity = (undefined1  [16])0x0;
        auStack_260[2] = 0;
        auStack_260[3] = 0;
        stack0xfffffffffffffdb0 = 0;
        uStack_24b = 0;
        local_248[0] = 0;
        local_248[1] = 0;
        local_248[2] = 0;
        local_23c = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&old_verbosity,0.0);
      }
      pnVar16 = (this->m_slack).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((pnVar16->m_backend).data._M_elems + lVar18 + -4) = local_248._0_8_;
      puVar1 = (pnVar16->m_backend).data._M_elems + lVar18 + -8;
      *(undefined8 *)puVar1 = auStack_260._8_8_;
      *(ulong *)(puVar1 + 2) = CONCAT35(uStack_24b,stack0xfffffffffffffdb0);
      puVar1 = (pnVar16->m_backend).data._M_elems + lVar18 + -0xc;
      *(undefined8 *)puVar1 = _old_verbosity;
      *(undefined8 *)(puVar1 + 2) = auStack_260._0_8_;
      (pnVar16->m_backend).data._M_elems[lVar18 + -2] = local_248[2];
      *(bool *)((pnVar16->m_backend).data._M_elems + lVar18 + -1) = local_23c;
      *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        **)((pnVar16->m_backend).data._M_elems + lVar18) = local_238;
      (this->m_rBasisStat).data[lVar20] = local_1f0[lVar20];
      lVar20 = lVar20 + 1;
      pnVar16 = (local_220->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar18 = lVar18 + 0xe;
    } while (lVar20 < (int)((ulong)((long)(local_220->val).
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar16
                                   ) >> 3) * -0x49249249);
  }
  this_00 = &this->m_hist;
  uVar19 = (uint)((ulong)((long)(this->m_hist).data.
                                super__Vector_base<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_hist).data.
                               super__Vector_base<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
  if (0 < (int)uVar19) {
    local_218 = &this->m_prim;
    local_220 = &this->m_dual;
    local_228 = &this->m_slack;
    local_200 = &this->m_redCost;
    local_208 = &this->m_cBasisStat;
    uVar21 = (ulong)(uVar19 & 0x7fffffff);
    uVar17 = uVar21 + 1;
    lVar18 = uVar21 << 4;
    do {
      (**(code **)(**(long **)((long)&(this_00->data).
                                      super__Vector_base<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[-1].
                                      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + lVar18) + 0x10))();
      plVar9 = *(long **)((long)&(this_00->data).
                                 super__Vector_base<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].
                                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + lVar18);
      (**(code **)(*plVar9 + 0x20))
                (plVar9,local_218,local_220,local_228,local_200,local_208,&this->m_rBasisStat,
                 isOptimal);
      std::
      vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
      ::resize(&this_00->data,uVar17 - 2);
      uVar17 = uVar17 - 1;
      lVar18 = lVar18 + -0x10;
    } while (1 < uVar17);
  }
  if (this->m_thesense == MAXIMIZE) {
    pnVar16 = (this->m_redCost).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->m_redCost).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar16) >> 3) *
            -0x49249249) {
      pnVar10 = (this->m_redCost).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar11 = (this->m_redCost).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar18 = 0x30;
      lVar20 = 0;
      do {
        pbVar3 = (byte *)((long)(pnVar16->m_backend).data._M_elems + lVar18 + -4);
        *pbVar3 = *pbVar3 ^ (*(int *)((long)(pnVar16->m_backend).data._M_elems + lVar18 + -0x30) !=
                             0 || *(int *)((long)(pnVar16->m_backend).data._M_elems + lVar18) != 0);
        lVar20 = lVar20 + 1;
        lVar18 = lVar18 + 0x38;
        pnVar16 = pnVar10;
      } while (lVar20 < (int)((ulong)((long)pnVar11 - (long)pnVar10) >> 3) * -0x49249249);
    }
    pnVar16 = (this->m_dual).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->m_dual).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar16) >> 3) *
            -0x49249249) {
      pnVar10 = (this->m_dual).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar11 = (this->m_dual).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar18 = 0x30;
      lVar20 = 0;
      do {
        pbVar3 = (byte *)((long)(pnVar16->m_backend).data._M_elems + lVar18 + -4);
        *pbVar3 = *pbVar3 ^ (*(int *)((long)(pnVar16->m_backend).data._M_elems + lVar18 + -0x30) !=
                             0 || *(int *)((long)(pnVar16->m_backend).data._M_elems + lVar18) != 0);
        lVar20 = lVar20 + 1;
        lVar18 = lVar18 + 0x38;
        pnVar16 = pnVar10;
      } while (lVar20 < (int)((ulong)((long)pnVar11 - (long)pnVar10) >> 3) * -0x49249249);
    }
  }
  if (0 < this->m_addedcols) {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(&this->m_prim,
            (int)((ulong)((long)(this->m_prim).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_prim).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249 -
            this->m_addedcols,true);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(&this->m_redCost,
            (int)((ulong)((long)(this->m_redCost).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_redCost).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249 -
            this->m_addedcols,true);
    DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
    ::reSize(&this->m_cBasisStat,(this->m_cBasisStat).thesize - this->m_addedcols);
    DataArray<int>::reSize(&this->m_cIdx,(this->m_cIdx).thesize - this->m_addedcols);
  }
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
  ::clear(&this_00->data);
  this->m_postsolved = true;
  return;
}

Assistant:

void SPxMainSM<R>::unsimplify(const VectorBase<R>& x, const VectorBase<R>& y,
                              const VectorBase<R>& s, const VectorBase<R>& r,
                              const typename SPxSolverBase<R>::VarStatus rows[],
                              const typename SPxSolverBase<R>::VarStatus cols[], bool isOptimal)
{
   SPX_MSG_INFO1((*this->spxout),
                 (*this->spxout) << " --- unsimplifying solution and basis" << std::endl;)
   assert(x.dim() <= m_prim.dim());
   assert(y.dim() <= m_dual.dim());
   assert(x.dim() == r.dim());
   assert(y.dim() == s.dim());

   // assign values of variables in reduced LP
   // NOTE: for maximization problems, we have to switch signs of dual and reduced cost values,
   // since simplifier assumes minimization problem
   for(int j = 0; j < x.dim(); ++j)
   {
      m_prim[j] = isZero(x[j], this->epsZero()) ? 0.0 : x[j];
      m_redCost[j] = isZero(r[j], this->epsZero()) ? 0.0 : (m_thesense == SPxLPBase<R>::MAXIMIZE ? -r[j] :
                     r[j]);
      m_cBasisStat[j] = cols[j];
   }

   for(int i = 0; i < y.dim(); ++i)
   {
      m_dual[i] = isZero(y[i], this->epsZero()) ? 0.0 : (m_thesense == SPxLPBase<R>::MAXIMIZE ? -y[i] :
                  y[i]);
      m_slack[i] = isZero(s[i], this->epsZero()) ? 0.0 : s[i];
      m_rBasisStat[i] = rows[i];
   }

   // undo preprocessing
   for(int k = m_hist.size() - 1; k >= 0; --k)
   {
      SPxOut::debug(this, "unsimplifying {} \n", m_hist[k]->getName());

      try
      {
         m_hist[k]->execute(m_prim, m_dual, m_slack, m_redCost, m_cBasisStat, m_rBasisStat, isOptimal);
      }
      catch(const SPxException& ex)
      {
         SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Exception thrown while unsimplifying " <<
                       m_hist[k]->getName() << ":\n" << ex.what() << "\n");
         throw SPxInternalCodeException("XMAISM00 Exception thrown during unsimply().");
      }

      m_hist.reSize(k);
   }

   // for maximization problems, we have to switch signs of dual and reduced cost values back
   if(m_thesense == SPxLPBase<R>::MAXIMIZE)
   {
      for(int j = 0; j < m_redCost.dim(); ++j)
         m_redCost[j] = -m_redCost[j];

      for(int i = 0; i < m_dual.dim(); ++i)
         m_dual[i] = -m_dual[i];
   }

   if(m_addedcols > 0)
   {
      assert(m_prim.dim() >= m_addedcols);
      m_prim.reDim(m_prim.dim() - m_addedcols);
      m_redCost.reDim(m_redCost.dim() - m_addedcols);
      m_cBasisStat.reSize(m_cBasisStat.size() - m_addedcols);
      m_cIdx.reSize(m_cIdx.size() - m_addedcols);
   }

#ifdef SOPLEX_CHECK_BASIS_DIM
   int numBasis = 0;

   for(int rs = 0; rs < m_rBasisStat.size(); ++rs)
   {
      if(m_rBasisStat[rs] == SPxSolverBase<R>::BASIC)
         numBasis ++;
   }

   for(int cs = 0; cs < m_cBasisStat.size(); ++cs)
   {
      if(m_cBasisStat[cs] == SPxSolverBase<R>::BASIC)
         numBasis ++;
   }

   if(numBasis != m_rBasisStat.size())
   {
      throw SPxInternalCodeException("XMAISM26 Dimension doesn't match after this step.");
   }

#endif

   m_hist.clear();
   m_postsolved = true;
}